

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qlayout.cpp
# Opt level: O3

void QLayout::qt_static_metacall(QObject *_o,Call _c,int _id,void **_a)

{
  QMargins *pQVar1;
  int *piVar2;
  int iVar3;
  int right;
  int top;
  int bottom;
  QMargins QVar4;
  
  if (_c == WriteProperty) {
    piVar2 = (int *)*_a;
    if (_id == 2) {
      if (*(int *)(*(long *)(_o + 8) + 0x90) != *piVar2) {
        *(int *)(*(long *)(_o + 8) + 0x90) = *piVar2;
        (**(code **)(*(long *)_o + 0x70))();
        return;
      }
    }
    else {
      if (_id == 1) {
        iVar3 = *piVar2;
        top = piVar2[1];
        right = piVar2[2];
        bottom = piVar2[3];
        goto LAB_002eb900;
      }
      if (_id == 0) {
        (**(code **)(*(long *)_o + 0x68))(_o,*piVar2);
        return;
      }
    }
  }
  else if (_c == ReadProperty) {
    pQVar1 = (QMargins *)*_a;
    if (_id == 2) {
      iVar3 = *(int *)(*(long *)(_o + 8) + 0x90);
    }
    else {
      if (_id == 1) {
        QVar4 = contentsMargins((QLayout *)_o);
        *pQVar1 = QVar4;
        return;
      }
      if (_id != 0) {
        return;
      }
      iVar3 = (**(code **)(*(long *)_o + 0x60))();
    }
    (pQVar1->m_left).m_i = iVar3;
  }
  else if (_id == 1 && _c == ResetProperty) {
    iVar3 = -1;
    top = -1;
    right = -1;
    bottom = -1;
LAB_002eb900:
    setContentsMargins((QLayout *)_o,iVar3,top,right,bottom);
    return;
  }
  return;
}

Assistant:

void QLayout::qt_static_metacall(QObject *_o, QMetaObject::Call _c, int _id, void **_a)
{
    auto *_t = static_cast<QLayout *>(_o);
    if (_c == QMetaObject::ReadProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: *reinterpret_cast<int*>(_v) = _t->spacing(); break;
        case 1: *reinterpret_cast<QMargins*>(_v) = _t->contentsMargins(); break;
        case 2: *reinterpret_cast<SizeConstraint*>(_v) = _t->sizeConstraint(); break;
        default: break;
        }
    }
    if (_c == QMetaObject::WriteProperty) {
        void *_v = _a[0];
        switch (_id) {
        case 0: _t->setSpacing(*reinterpret_cast<int*>(_v)); break;
        case 1: _t->setContentsMargins(*reinterpret_cast<QMargins*>(_v)); break;
        case 2: _t->setSizeConstraint(*reinterpret_cast<SizeConstraint*>(_v)); break;
        default: break;
        }
    }
if (_c == QMetaObject::ResetProperty) {
        switch (_id) {
        case 1: _t->unsetContentsMargins(); break;
        default: break;
        }
    }
}